

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::DuplicateRowsPS::DuplicateRowsPS
          (DuplicateRowsPS *this,SPxLPBase<double> *lp,int _i,int maxLhsIdx,int minRhsIdx,
          DSVectorBase<double> *dupRows,Array<double> scale,DataArray<int> perm,
          DataArray<bool> isLhsEqualRhs,bool isTheLast,bool isFixedRow,
          shared_ptr<soplex::Tolerances> tols,bool isFirst)

{
  SPxSense SVar1;
  int iVar2;
  long lVar3;
  int k;
  long lVar4;
  double dVar5;
  double local_68;
  DataArray<bool> *local_60;
  DataArray<int> *local_58;
  DataArray<int> *local_50;
  double local_48;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             (__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)perm.memFactor);
  PostStep::PostStep(&this->super_PostStep,"DuplicateRows",
                     (shared_ptr<soplex::Tolerances> *)&local_40,
                     (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,
                     (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__DuplicateRowsPS_0053eb70;
  this->m_i = _i;
  SVar1 = lp->thesense;
  dVar5 = (lp->super_LPRowSetBase<double>).object.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[_i];
  if (SVar1 == MINIMIZE) {
    dVar5 = -dVar5;
  }
  this->m_i_rowObj = dVar5;
  this->m_maxLhsIdx = maxLhsIdx;
  this->m_minRhsIdx = minRhsIdx;
  this->m_maxSense = SVar1 == MAXIMIZE;
  this->m_isFirst = isLhsEqualRhs.thesize._0_1_;
  this->m_isLast = perm.thesize._0_1_;
  this->m_fixed = perm.data._0_1_;
  this->m_nCols = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  DSVectorBase<double>::DSVectorBase(&this->m_scale,(dupRows->super_SVectorBase<double>).memused);
  DSVectorBase<double>::DSVectorBase(&this->m_rowObj,(dupRows->super_SVectorBase<double>).memused);
  DataArray<int>::DataArray
            (&this->m_rIdxLocalOld,(dupRows->super_SVectorBase<double>).memused,0,1.2);
  local_58 = &this->m_perm;
  local_50 = &this->m_rIdxLocalOld;
  DataArray<int>::DataArray
            (local_58,(DataArray<int> *)
                      scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  local_60 = &this->m_isLhsEqualRhs;
  DataArray<bool>::DataArray
            (local_60,(DataArray<bool> *)
                      scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_48 = *(double *)
              ((long)*scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + (long)_i * 8);
  lVar3 = 8;
  for (lVar4 = 0; lVar4 < (dupRows->super_SVectorBase<double>).memused; lVar4 = lVar4 + 1) {
    iVar2 = *(int *)((long)&((dupRows->super_SVectorBase<double>).m_elem)->val + lVar3);
    local_68 = local_48 /
               *(double *)
                ((long)*scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + (long)iVar2 * 8);
    DSVectorBase<double>::add(&this->m_scale,iVar2,&local_68);
    iVar2 = *(int *)((long)&((dupRows->super_SVectorBase<double>).m_elem)->val + lVar3);
    local_68 = (lp->super_LPRowSetBase<double>).object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar2];
    if (lp->thesense == MINIMIZE) {
      local_68 = -local_68;
    }
    DSVectorBase<double>::add(&this->m_rowObj,iVar2,&local_68);
    (this->m_rIdxLocalOld).data[lVar4] =
         *(int *)((long)&((dupRows->super_SVectorBase<double>).m_elem)->val + lVar3);
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

DuplicateRowsPS(const SPxLPBase<R>& lp, int _i,
                      int maxLhsIdx, int minRhsIdx, const DSVectorBase<R>& dupRows,
                      const Array<R> scale, const DataArray<int> perm, const DataArray<bool> isLhsEqualRhs,
                      bool isTheLast, bool isFixedRow, std::shared_ptr<Tolerances> tols, bool isFirst = false)
         : PostStep("DuplicateRows", tols, lp.nRows(), lp.nCols())
         , m_i(_i)
         , m_i_rowObj(lp.rowObj(_i))
         , m_maxLhsIdx((maxLhsIdx == -1) ? -1 : maxLhsIdx)
         , m_minRhsIdx((minRhsIdx == -1) ? -1 : minRhsIdx)
         , m_maxSense(lp.spxSense() == SPxLPBase<R>::MAXIMIZE)
         , m_isFirst(isFirst)
         , m_isLast(isTheLast)
         , m_fixed(isFixedRow)
         , m_nCols(lp.nCols())
         , m_scale(dupRows.size())
         , m_rowObj(dupRows.size())
         , m_rIdxLocalOld(dupRows.size())
         , m_perm(perm)
         , m_isLhsEqualRhs(isLhsEqualRhs)
      {
         R rowScale = scale[_i];

         for(int k = 0; k < dupRows.size(); ++k)
         {
            m_scale.add(dupRows.index(k), rowScale / scale[dupRows.index(k)]);
            m_rowObj.add(dupRows.index(k), lp.rowObj(dupRows.index(k)));
            m_rIdxLocalOld[k] = dupRows.index(k);
         }
      }